

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

longlong chaiscript::bootstrap::parse_string<long_long>(string *i)

{
  longlong t;
  stringstream ss;
  longlong local_198;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190,(string *)i,_S_out|_S_in);
  std::istream::_M_extract<long_long>((longlong *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return local_198;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }